

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

string * __thiscall
google::protobuf::Reflection::GetStringReference
          (Reflection *this,Message *message,FieldDescriptor *field,string *scratch)

{
  bool bVar1;
  CppType CVar2;
  int number;
  CppStringType CVar3;
  Reflection *pRVar4;
  Descriptor *actual;
  Descriptor *pDVar5;
  ExtensionSet *this_00;
  string *default_value;
  Cord **ppCVar6;
  Cord *src;
  InlinedStringField *this_01;
  MicroString *this_02;
  ArenaStringPtr *this_03;
  Reflection *local_b8;
  ArenaStringPtr *str;
  allocator<char> local_61;
  string_view local_60;
  string local_50 [32];
  Reflection *local_30;
  string *scratch_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  local_30 = (Reflection *)scratch;
  scratch_local = (string *)field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  pRVar4 = Message::GetReflection(message);
  if (this != pRVar4) {
    pDVar5 = this->descriptor_;
    actual = Message::GetDescriptor((Message *)field_local);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar5,actual,(FieldDescriptor *)scratch_local,"GetStringReference");
  }
  pDVar5 = FieldDescriptor::containing_type((FieldDescriptor *)scratch_local);
  if (pDVar5 != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,(FieldDescriptor *)scratch_local,"GetStringReference",
               "Field does not match message type.");
  }
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)scratch_local);
  if (bVar1) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,(FieldDescriptor *)scratch_local,"GetStringReference",
               "Field is repeated; the method requires a singular field.");
  }
  CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)scratch_local);
  if (CVar2 != CPPTYPE_STRING) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (this->descriptor_,(FieldDescriptor *)scratch_local,"GetStringReference",
               CPPTYPE_STRING);
  }
  bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)scratch_local);
  if (bVar1) {
    this_00 = GetExtensionSet(this,(Message *)field_local);
    number = FieldDescriptor::number((FieldDescriptor *)scratch_local);
    default_value =
         internal::DefaultValueStringAsString_abi_cxx11_((FieldDescriptor *)scratch_local);
    this_local = (Reflection *)internal::ExtensionSet::GetString(this_00,number,default_value);
  }
  else {
    bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,(FieldDescriptor *)scratch_local)
    ;
    if ((!bVar1) ||
       (bVar1 = HasOneofField(this,(Message *)field_local,(FieldDescriptor *)scratch_local), bVar1))
    {
      CVar3 = FieldDescriptor::cpp_string_type((FieldDescriptor *)scratch_local);
      if (CVar3 != kView) {
        if (CVar3 == kCord) {
          bVar1 = internal::ReflectionSchema::InRealOneof
                            (&this->schema_,(FieldDescriptor *)scratch_local);
          if (bVar1) {
            ppCVar6 = GetField<absl::lts_20250127::Cord*>
                                (this,(Message *)field_local,(FieldDescriptor *)scratch_local);
            absl::lts_20250127::CopyCordToString(*ppCVar6,(Nonnull<std::string_*>)local_30);
          }
          else {
            src = GetField<absl::lts_20250127::Cord>
                            (this,(Message *)field_local,(FieldDescriptor *)scratch_local);
            absl::lts_20250127::CopyCordToString(src,(Nonnull<std::string_*>)local_30);
          }
          return (string *)local_30;
        }
        if (CVar3 != kString) {
          internal::Unreachable
                    ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                     ,0x7b1);
        }
      }
      bVar1 = IsInlined(this,(FieldDescriptor *)scratch_local);
      if (bVar1) {
        this_01 = GetField<google::protobuf::internal::InlinedStringField>
                            (this,(Message *)field_local,(FieldDescriptor *)scratch_local);
        this_local = (Reflection *)internal::InlinedStringField::GetNoArena_abi_cxx11_(this_01);
      }
      else {
        bVar1 = IsMicroString(this,(FieldDescriptor *)scratch_local);
        if (bVar1) {
          this_02 = GetField<google::protobuf::internal::MicroString>
                              (this,(Message *)field_local,(FieldDescriptor *)scratch_local);
          local_60 = internal::MicroString::Get(this_02);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    (local_50,&local_60,&local_61);
          std::__cxx11::string::operator=((string *)local_30,local_50);
          std::__cxx11::string::~string(local_50);
          std::allocator<char>::~allocator(&local_61);
          this_local = local_30;
        }
        else {
          this_03 = GetField<google::protobuf::internal::ArenaStringPtr>
                              (this,(Message *)field_local,(FieldDescriptor *)scratch_local);
          bVar1 = internal::ArenaStringPtr::IsDefault(this_03);
          if (bVar1) {
            local_b8 = (Reflection *)
                       internal::DefaultValueStringAsString_abi_cxx11_
                                 ((FieldDescriptor *)scratch_local);
          }
          else {
            local_b8 = (Reflection *)internal::ArenaStringPtr::Get_abi_cxx11_(this_03);
          }
          this_local = local_b8;
        }
      }
    }
    else {
      this_local = (Reflection *)
                   internal::DefaultValueStringAsString_abi_cxx11_((FieldDescriptor *)scratch_local)
      ;
    }
  }
  return (string *)this_local;
}

Assistant:

const std::string& Reflection::GetStringReference(const Message& message,
                                                  const FieldDescriptor* field,
                                                  std::string* scratch) const {
  (void)scratch;  // Parameter is used by Google-internal code.
  USAGE_CHECK_ALL(GetStringReference, SINGULAR, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetString(
        field->number(), internal::DefaultValueStringAsString(field));
  } else {
    if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
      return internal::DefaultValueStringAsString(field);
    }
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        if (schema_.InRealOneof(field)) {
          absl::CopyCordToString(*GetField<absl::Cord*>(message, field),
                                 scratch);
        } else {
          absl::CopyCordToString(GetField<absl::Cord>(message, field), scratch);
        }
        return *scratch;
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString:
        if (IsInlined(field)) {
          return GetField<InlinedStringField>(message, field).GetNoArena();
        } else if (IsMicroString(field)) {
          *scratch = std::string(GetField<MicroString>(message, field).Get());
          return *scratch;
        } else {
          const auto& str = GetField<ArenaStringPtr>(message, field);
          return str.IsDefault() ? internal::DefaultValueStringAsString(field)
                                 : str.Get();
        }
    }
    internal::Unreachable();
  }
}